

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

VmValue * CompileVmDoWhile(ExpressionContext *ctx,VmModule *module,ExprDoWhile *node)

{
  uint uVar1;
  LoopInfo *pLVar2;
  Allocator *pAVar3;
  int iVar4;
  VmBlock *block;
  VmBlock *block_00;
  VmBlock *block_01;
  VmValue *pVVar5;
  undefined4 extraout_var;
  
  block = anon_unknown.dwarf_12e14a::CreateBlock(module,(node->super_ExprBase).source,"do_body");
  block_00 = anon_unknown.dwarf_12e14a::CreateBlock(module,(node->super_ExprBase).source,"do_cond");
  block_01 = anon_unknown.dwarf_12e14a::CreateBlock(module,(node->super_ExprBase).source,"do_exit");
  anon_unknown.dwarf_12e14a::CreateJump(module,(node->super_ExprBase).source,&block->super_VmValue);
  VmFunction::AddBlock(module->currentFunction,block);
  module->currentBlock = block;
  uVar1 = (module->loopInfo).count;
  if (uVar1 == (module->loopInfo).max) {
    SmallArray<VmModule::LoopInfo,_32U>::grow(&module->loopInfo,uVar1);
  }
  pLVar2 = (module->loopInfo).data;
  if (pLVar2 != (LoopInfo *)0x0) {
    uVar1 = (module->loopInfo).count;
    (module->loopInfo).count = uVar1 + 1;
    pLVar2[uVar1].breakBlock = block_01;
    pLVar2[uVar1].continueBlock = block_00;
    CompileVm(ctx,module,node->body);
    anon_unknown.dwarf_12e14a::CreateJump
              (module,(node->super_ExprBase).source,&block_00->super_VmValue);
    VmFunction::AddBlock(module->currentFunction,block_00);
    module->currentBlock = block_00;
    pVVar5 = CompileVm(ctx,module,node->condition);
    anon_unknown.dwarf_12e14a::CreateJumpNotZero
              (module,(node->super_ExprBase).source,pVVar5,&block->super_VmValue,
               &block_01->super_VmValue);
    VmFunction::AddBlock(module->currentFunction,block_01);
    module->currentBlock = block_01;
    uVar1 = (module->loopInfo).count;
    if (uVar1 != 0) {
      (module->loopInfo).count = uVar1 - 1;
      iVar4 = (*module->allocator->_vptr_Allocator[2])(module->allocator,0x98);
      pVVar5 = (VmValue *)CONCAT44(extraout_var,iVar4);
      pAVar3 = module->allocator;
      pVVar5->typeID = 0;
      pVVar5->source = (SynBase *)0x0;
      (pVVar5->comment).begin = (char *)0x0;
      (pVVar5->type).type = VM_TYPE_VOID;
      (pVVar5->type).size = 0;
      (pVVar5->type).structType = (TypeBase *)0x0;
      (pVVar5->comment).end = (char *)0x0;
      (pVVar5->users).allocator = pAVar3;
      (pVVar5->users).data = (pVVar5->users).little;
      (pVVar5->users).count = 0;
      (pVVar5->users).max = 8;
      pVVar5->hasKnownNonSimpleUse = false;
      pVVar5->hasSideEffects = false;
      pVVar5->hasMemoryAccess = false;
      pVVar5->canBeRemoved = true;
      pVVar5->hasKnownSimpleUse = false;
      pVVar5->_vptr_VmValue = (_func_int **)&PTR__VmValue_00241c60;
      pVVar5 = anon_unknown.dwarf_12e14a::CheckType
                         (ctx,(ExprBase *)(node->super_ExprBase).type,pVVar5);
      return pVVar5;
    }
    __assert_fail("count > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                  ,0x183,
                  "void SmallArray<VmModule::LoopInfo, 32>::pop_back() [T = VmModule::LoopInfo, N = 32]"
                 );
  }
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x162,
                "void SmallArray<VmModule::LoopInfo, 32>::push_back(const T &) [T = VmModule::LoopInfo, N = 32]"
               );
}

Assistant:

VmValue* CompileVmDoWhile(ExpressionContext &ctx, VmModule *module, ExprDoWhile *node)
{
	VmBlock *bodyBlock = CreateBlock(module, node->source, "do_body");
	VmBlock *condBlock = CreateBlock(module, node->source, "do_cond");
	VmBlock *exitBlock = CreateBlock(module, node->source, "do_exit");

	CreateJump(module, node->source, bodyBlock);

	module->currentFunction->AddBlock(bodyBlock);
	module->currentBlock = bodyBlock;

	module->loopInfo.push_back(VmModule::LoopInfo(exitBlock, condBlock));

	CompileVm(ctx, module, node->body);

	CreateJump(module, node->source, condBlock);

	module->currentFunction->AddBlock(condBlock);
	module->currentBlock = condBlock;

	VmValue* condition = CompileVm(ctx, module, node->condition);

	CreateJumpNotZero(module, node->source, condition, bodyBlock, exitBlock);

	module->currentFunction->AddBlock(exitBlock);
	module->currentBlock = exitBlock;

	module->loopInfo.pop_back();

	return CheckType(ctx, node, CreateVoid(module));
}